

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

void __thiscall
EOPlus::Parser_Token_Server_Base::~Parser_Token_Server_Base(Parser_Token_Server_Base *this)

{
  Parser_Token_Server_Base *this_local;
  
  this->_vptr_Parser_Token_Server_Base = (_func_int **)&PTR___cxa_pure_virtual_002c56f8;
  Token::~Token(&this->reject_token);
  std::stack<EOPlus::Token,_std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>_>::~stack
            (&this->token_buffer);
  return;
}

Assistant:

Parser_Token_Server_Base::~Parser_Token_Server_Base()
	{ }